

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cutNode.c
# Opt level: O3

Cut_Cut_t * Cut_NodeUnionCuts(Cut_Man_t *p,Vec_Int_t *vNodes)

{
  uint uVar1;
  Cut_Cut_t *pCVar2;
  Cut_Cut_t *pCVar3;
  __time_t _Var4;
  int iVar5;
  int iVar6;
  uint uVar7;
  Cut_Cut_t *pCVar8;
  void **ppvVar9;
  timespec *ptVar10;
  Vec_Ptr_t *pVVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  undefined1 auVar15 [16];
  Cut_Cut_t *pHead;
  Cut_List_t Super;
  Cut_Cut_t *local_130;
  long local_120;
  timespec local_110;
  Cut_List_t local_100;
  
  uVar1 = p->pParams->nVarsMax;
  iVar5 = clock_gettime(3,(timespec *)&local_100);
  if (iVar5 < 0) {
    local_120 = 1;
  }
  else {
    lVar12 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816((long)local_100.pHead[1]),8);
    local_120 = ((lVar12 >> 7) - (lVar12 >> 0x3f)) + (long)local_100.pHead[0] * -1000000;
  }
  local_100.pHead[1] = (Cut_Cut_t *)0x0;
  local_100.pHead[2] = (Cut_Cut_t *)0x0;
  local_100.pHead[3] = (Cut_Cut_t *)0x0;
  local_100.pHead[4] = (Cut_Cut_t *)0x0;
  local_100.pHead[5] = (Cut_Cut_t *)0x0;
  local_100.pHead[6] = (Cut_Cut_t *)0x0;
  local_100.pHead[7] = (Cut_Cut_t *)0x0;
  local_100.pHead[8] = (Cut_Cut_t *)0x0;
  local_100.pHead[9] = (Cut_Cut_t *)0x0;
  local_100.pHead[10] = (Cut_Cut_t *)0x0;
  local_100.pHead[0xb] = (Cut_Cut_t *)0x0;
  local_100.pHead[0xc] = (Cut_Cut_t *)0x0;
  lVar13 = 1;
  lVar14 = 2;
  lVar12 = 0xe;
  auVar15._8_4_ = (int)&local_100;
  auVar15._0_8_ = &local_100;
  auVar15._12_4_ = (int)((ulong)&local_100 >> 0x20);
  do {
    local_100.pHead[lVar12] = (Cut_Cut_t *)(local_100.pHead + lVar13);
    local_100.pHead[lVar12 + 1] = (Cut_Cut_t *)(lVar14 * 8 + auVar15._8_8_);
    lVar13 = lVar13 + 2;
    lVar14 = lVar14 + 2;
    lVar12 = lVar12 + 2;
  } while (lVar12 != 0x1a);
  if (vNodes->nSize < 1) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                  ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
  iVar5 = *vNodes->pArray;
  p->nNodeCuts = 1;
  p->vTemp->nSize = 0;
  lVar12 = 1;
  lVar13 = 0;
  local_130 = (Cut_Cut_t *)0x0;
  do {
    iVar6 = vNodes->pArray[lVar13];
    pCVar8 = Cut_NodeReadCutsNew(p,iVar6);
    Cut_NodeWriteCutsNew(p,iVar6,(Cut_Cut_t *)0x0);
    if (pCVar8 == (Cut_Cut_t *)0x0) {
      __assert_fail("pList",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/cut/cutNode.c"
                    ,700,"Cut_Cut_t *Cut_NodeUnionCuts(Cut_Man_t *, Vec_Int_t *)");
    }
    pCVar2 = pCVar8->pNext;
    pCVar8->pNext = (Cut_Cut_t *)0x0;
    if (lVar13 == 0) {
      if (0xbfffffff < *(uint *)pCVar8 + 0xf0000000) {
LAB_004b6e0e:
        __assert_fail("pCut->nLeaves > 0 && pCut->nLeaves <= CUT_SIZE_MAX",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/cut/cutList.h"
                      ,0x59,"void Cut_ListAdd(Cut_List_t *, Cut_Cut_t *)");
      }
      *local_100.ppTail[*(uint *)pCVar8 >> 0x1c] = pCVar8;
      local_100.ppTail[*(uint *)pCVar8 >> 0x1c] = &pCVar8->pNext;
      local_130 = pCVar8;
    }
    else {
      Cut_CutRecycle(p,pCVar8);
    }
joined_r0x004b6a15:
    pCVar8 = pCVar2;
    if (pCVar8 != (Cut_Cut_t *)0x0) {
      uVar7 = *(uint *)pCVar8;
      if (uVar7 >> 0x1c != uVar1) {
        pCVar2 = pCVar8->pNext;
        if (p->pParams->fFilter != 0) goto code_r0x004b6a3a;
        goto LAB_004b6a52;
      }
      pVVar11 = p->vTemp;
      uVar7 = pVVar11->nSize;
      if (uVar7 == pVVar11->nCap) {
        if ((int)uVar7 < 0x10) {
          if (pVVar11->pArray == (void **)0x0) {
            ppvVar9 = (void **)malloc(0x80);
          }
          else {
            ppvVar9 = (void **)realloc(pVVar11->pArray,0x80);
          }
          pVVar11->pArray = ppvVar9;
          pVVar11->nCap = 0x10;
        }
        else {
          if (pVVar11->pArray == (void **)0x0) {
            ppvVar9 = (void **)malloc((ulong)uVar7 << 4);
          }
          else {
            ppvVar9 = (void **)realloc(pVVar11->pArray,(ulong)uVar7 << 4);
          }
          pVVar11->pArray = ppvVar9;
          pVVar11->nCap = uVar7 * 2;
        }
      }
      else {
        ppvVar9 = pVVar11->pArray;
      }
      iVar6 = pVVar11->nSize;
      pVVar11->nSize = iVar6 + 1;
      ppvVar9[iVar6] = pCVar8;
    }
    lVar13 = lVar13 + 1;
    lVar12 = lVar12 + 1;
  } while (lVar13 < vNodes->nSize);
  pVVar11 = p->vTemp;
  if (0 < pVVar11->nSize) {
    lVar12 = 1;
    lVar13 = 0;
    do {
      pCVar8 = (Cut_Cut_t *)pVVar11->pArray[lVar13];
      if ((Cut_Cut_t *)pVVar11->pArray[lVar13] != (Cut_Cut_t *)0x0) {
        do {
          pCVar2 = pCVar8->pNext;
          if ((p->pParams->fFilter == 0) ||
             (iVar6 = Cut_CutFilterOne(p,&local_100,pCVar8), iVar6 == 0)) {
            uVar1 = *(uint *)pCVar8;
            *(uint *)pCVar8 = (uVar1 & 0xff7fffff) + ((*(uint *)local_130 ^ uVar1) & 0x400000) * 2;
            pCVar3 = pCVar8->pNext;
            pCVar8->pNext = (Cut_Cut_t *)0x0;
            if (0xbfffffff < uVar1 + 0xf0000000) goto LAB_004b6e0e;
            *local_100.ppTail[uVar1 >> 0x1c] = pCVar8;
            local_100.ppTail[*(uint *)pCVar8 >> 0x1c] = &pCVar8->pNext;
            iVar6 = p->nNodeCuts + 1;
            p->nNodeCuts = iVar6;
            if (iVar6 == p->pParams->nKeepMax) goto joined_r0x004b6db0;
          }
          pCVar8 = pCVar2;
        } while (pCVar2 != (Cut_Cut_t *)0x0);
        pVVar11 = p->vTemp;
      }
      lVar13 = lVar13 + 1;
      lVar12 = lVar12 + 1;
    } while (lVar13 < pVVar11->nSize);
  }
LAB_004b6cd2:
  pCVar8 = Cut_NodeReadCutsNew(p,iVar5);
  if (pCVar8 == (Cut_Cut_t *)0x0) {
    ptVar10 = &local_110;
    local_110.tv_sec = 0;
    lVar12 = 1;
    do {
      if (local_100.pHead[lVar12] != (Cut_Cut_t *)0x0) {
        ptVar10->tv_sec = (__time_t)local_100.pHead[lVar12];
        ptVar10 = (timespec *)local_100.ppTail[lVar12];
      }
      lVar12 = lVar12 + 1;
    } while (lVar12 != 0xd);
    ptVar10->tv_sec = 0;
    _Var4 = local_110.tv_sec;
    Cut_NodeWriteCutsNew(p,iVar5,(Cut_Cut_t *)local_110.tv_sec);
    iVar5 = clock_gettime(3,&local_110);
    if (iVar5 < 0) {
      lVar12 = -1;
    }
    else {
      lVar12 = local_110.tv_nsec / 1000 + local_110.tv_sec * 1000000;
    }
    p->timeUnion = p->timeUnion + lVar12 + local_120;
    p->nNodes = (p->nNodes - vNodes->nSize) + 1;
    return (Cut_Cut_t *)_Var4;
  }
  __assert_fail("Cut_NodeReadCutsNew(p, Root) == NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/cut/cutNode.c"
                ,0x303,"Cut_Cut_t *Cut_NodeUnionCuts(Cut_Man_t *, Vec_Int_t *)");
code_r0x004b6a3a:
  iVar6 = Cut_CutFilterOne(p,&local_100,pCVar8);
  if (iVar6 == 0) {
    uVar7 = *(uint *)pCVar8;
LAB_004b6a52:
    *(uint *)pCVar8 = (uVar7 & 0xff7fffff) + ((*(uint *)local_130 ^ uVar7) & 0x400000) * 2;
    pCVar3 = pCVar8->pNext;
    pCVar8->pNext = (Cut_Cut_t *)0x0;
    if (0xbfffffff < uVar7 + 0xf0000000) goto LAB_004b6e0e;
    *local_100.ppTail[uVar7 >> 0x1c] = pCVar8;
    local_100.ppTail[*(uint *)pCVar8 >> 0x1c] = &pCVar8->pNext;
    iVar6 = p->nNodeCuts + 1;
    p->nNodeCuts = iVar6;
    if (iVar6 == p->pParams->nKeepMax) goto joined_r0x004b6c58;
  }
  goto joined_r0x004b6a15;
joined_r0x004b6c58:
  while (pCVar3 != (Cut_Cut_t *)0x0) {
    pCVar8 = pCVar3->pNext;
    Cut_CutRecycle(p,pCVar3);
    pCVar3 = pCVar8;
  }
  if ((int)lVar13 + 1 < vNodes->nSize) {
    do {
      Cut_NodeFreeCuts(p,vNodes->pArray[lVar12]);
      lVar12 = lVar12 + 1;
    } while ((int)lVar12 < vNodes->nSize);
  }
  pVVar11 = p->vTemp;
  if (0 < pVVar11->nSize) {
    lVar12 = 0;
    do {
      pCVar8 = (Cut_Cut_t *)pVVar11->pArray[lVar12];
      if ((Cut_Cut_t *)pVVar11->pArray[lVar12] != (Cut_Cut_t *)0x0) {
        do {
          pCVar2 = pCVar8->pNext;
          Cut_CutRecycle(p,pCVar8);
          pCVar8 = pCVar2;
        } while (pCVar2 != (Cut_Cut_t *)0x0);
        pVVar11 = p->vTemp;
      }
      lVar12 = lVar12 + 1;
    } while (lVar12 < pVVar11->nSize);
  }
  goto LAB_004b6cd2;
joined_r0x004b6db0:
  while (pCVar3 != (Cut_Cut_t *)0x0) {
    pCVar8 = pCVar3->pNext;
    Cut_CutRecycle(p,pCVar3);
    pCVar3 = pCVar8;
  }
  pVVar11 = p->vTemp;
  if ((int)lVar13 + 1 < pVVar11->nSize) {
    do {
      pCVar8 = (Cut_Cut_t *)pVVar11->pArray[lVar12];
      if ((Cut_Cut_t *)pVVar11->pArray[lVar12] != (Cut_Cut_t *)0x0) {
        do {
          pCVar2 = pCVar8->pNext;
          Cut_CutRecycle(p,pCVar8);
          pCVar8 = pCVar2;
        } while (pCVar2 != (Cut_Cut_t *)0x0);
        pVVar11 = p->vTemp;
      }
      lVar12 = lVar12 + 1;
    } while ((int)lVar12 < pVVar11->nSize);
  }
  goto LAB_004b6cd2;
}

Assistant:

Cut_Cut_t * Cut_NodeUnionCuts( Cut_Man_t * p, Vec_Int_t * vNodes )
{
    Cut_List_t Super, * pSuper = &Super;
    Cut_Cut_t * pList, * pListStart, * pCut, * pCut2;
    Cut_Cut_t * pTop = NULL; // Suppress "might be used uninitialized"
    int i, k, Node, Root, Limit = p->pParams->nVarsMax;
    abctime clk = Abc_Clock();

    // start the new list
    Cut_ListStart( pSuper );

    // remember the root node to save the resulting cuts
    Root = Vec_IntEntry( vNodes, 0 );
    p->nNodeCuts = 1;

    // collect small cuts first
    Vec_PtrClear( p->vTemp );
    Vec_IntForEachEntry( vNodes, Node, i )
    {
        // get the cuts of this node
        pList = Cut_NodeReadCutsNew( p, Node );
        Cut_NodeWriteCutsNew( p, Node, NULL );
        assert( pList );
        // remember the starting point
        pListStart = pList->pNext;
        pList->pNext = NULL;
        // save or recycle the elementary cut
        if ( i == 0 )
            Cut_ListAdd( pSuper, pList ), pTop = pList;
        else
            Cut_CutRecycle( p, pList );
        // save all the cuts that are smaller than the limit
        Cut_ListForEachCutSafe( pListStart, pCut, pCut2 )
        {
            if ( pCut->nLeaves == (unsigned)Limit )
            {
                Vec_PtrPush( p->vTemp, pCut );
                break;
            }
            // check containment
            if ( p->pParams->fFilter && Cut_CutFilterOne( p, pSuper, pCut ) )
                continue;
            // set the complemented bit by comparing the first cut with the current cut
            pCut->fCompl = pTop->fSimul ^ pCut->fSimul;
            pListStart = pCut->pNext;
            pCut->pNext = NULL;
            // add to the list
            Cut_ListAdd( pSuper, pCut );
            if ( ++p->nNodeCuts == p->pParams->nKeepMax )
            {
                // recycle the rest of the cuts of this node
                Cut_ListForEachCutSafe( pListStart, pCut, pCut2 )
                    Cut_CutRecycle( p, pCut );
                // recycle all cuts of other nodes
                Vec_IntForEachEntryStart( vNodes, Node, k, i+1 )
                    Cut_NodeFreeCuts( p, Node );
                // recycle the saved cuts of other nodes
                Vec_PtrForEachEntry( Cut_Cut_t *, p->vTemp, pList, k )
                    Cut_ListForEachCutSafe( pList, pCut, pCut2 )
                        Cut_CutRecycle( p, pCut );
                goto finish;
            }
        }
    } 
    // collect larger cuts next
    Vec_PtrForEachEntry( Cut_Cut_t *, p->vTemp, pList, i )
    {
        Cut_ListForEachCutSafe( pList, pCut, pCut2 )
        {
            // check containment
            if ( p->pParams->fFilter && Cut_CutFilterOne( p, pSuper, pCut ) )
                continue;
            // set the complemented bit
            pCut->fCompl = pTop->fSimul ^ pCut->fSimul;
            pListStart = pCut->pNext;
            pCut->pNext = NULL;
            // add to the list
            Cut_ListAdd( pSuper, pCut );
            if ( ++p->nNodeCuts == p->pParams->nKeepMax )
            {
                // recycle the rest of the cuts
                Cut_ListForEachCutSafe( pListStart, pCut, pCut2 )
                    Cut_CutRecycle( p, pCut );
                // recycle the saved cuts of other nodes
                Vec_PtrForEachEntryStart( Cut_Cut_t *, p->vTemp, pList, k, i+1 )
                    Cut_ListForEachCutSafe( pList, pCut, pCut2 )
                        Cut_CutRecycle( p, pCut );
                goto finish;
            }
        }
    }
finish :
    // set the cuts at the node
    assert( Cut_NodeReadCutsNew(p, Root) == NULL );
    pList = Cut_ListFinish( pSuper );
    Cut_NodeWriteCutsNew( p, Root, pList );
p->timeUnion += Abc_Clock() - clk;
    // filter the cuts
//clk = Abc_Clock();
//    if ( p->pParams->fFilter )
//        Cut_CutFilter( p, pList );
//p->timeFilter += Abc_Clock() - clk;
    p->nNodes -= vNodes->nSize - 1;
    return pList;
}